

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS VerifyJsonParsesAsNumberObjectSigned(_Bool IsJson5,char *Json,int64_t Number)

{
  JL_STATUS JVar1;
  bool bVar2;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  JlDataObject *pJStack_40;
  _Bool _result;
  int64_t num64;
  size_t sStack_30;
  WJTL_STATUS TestReturn;
  size_t errorAtPos;
  JlDataObject *object;
  int64_t Number_local;
  char *Json_local;
  _Bool IsJson5_local;
  
  errorAtPos = 0;
  sStack_30 = 100;
  num64._4_4_ = WJTL_STATUS_SUCCESS;
  object = (JlDataObject *)Number;
  Number_local = (int64_t)Json;
  Json_local._7_1_ = IsJson5;
  JVar1 = JlParseJsonEx(Json,IsJson5,(JlDataObject **)&errorAtPos,&stack0xffffffffffffffd0);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &object, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsNumberObjectSigned",0xf9);
  if (JVar1 != JL_STATUS_SUCCESS) {
    num64._4_4_ = WJTL_STATUS_FAILED;
  }
  if (errorAtPos != 0) {
    bVar2 = errorAtPos != 0;
    WjTestLib_Assert(bVar2,"(object) != NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectSigned",0xfc);
    if (!bVar2) {
      num64._4_4_ = WJTL_STATUS_FAILED;
    }
    bVar2 = sStack_30 == 0;
    WjTestLib_Assert(bVar2,"errorAtPos == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectSigned",0xfd);
    if (!bVar2) {
      num64._4_4_ = WJTL_STATUS_FAILED;
    }
    JVar1 = JlGetObjectNumberS64((JlDataObject *)errorAtPos,(int64_t *)&stack0xffffffffffffffc0);
    WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlGetObjectNumberS64( object, &num64 ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectSigned",0xff);
    if (JVar1 != JL_STATUS_SUCCESS) {
      num64._4_4_ = WJTL_STATUS_FAILED;
    }
    bVar2 = object == pJStack_40;
    WjTestLib_Assert(bVar2,"Number == num64",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectSigned",0x100);
    if (!bVar2) {
      num64._4_4_ = WJTL_STATUS_FAILED;
    }
    JVar1 = JlFreeObjectTree((JlDataObject **)&errorAtPos);
    WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeObjectTree( &object ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectSigned",0x102);
    if (JVar1 != JL_STATUS_SUCCESS) {
      num64._4_4_ = WJTL_STATUS_FAILED;
    }
    bVar2 = errorAtPos == 0;
    WjTestLib_Assert(bVar2,"(object) == NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectSigned",0x103);
    if (!bVar2) {
      num64._4_4_ = WJTL_STATUS_FAILED;
    }
  }
  return num64._4_4_;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsNumberObjectSigned
    (
        bool            IsJson5,
        char const*     Json,
        int64_t         Number
    )
{
    JlDataObject*   object = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    int64_t        num64;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &object, &errorAtPos ) );
    if( NULL != object )
    {
        JL_ASSERT_NOT_NULL( object );
        JL_ASSERT( errorAtPos == 0 );

        JL_ASSERT_SUCCESS( JlGetObjectNumberS64( object, &num64 ) );
        JL_ASSERT( Number == num64 );

        JL_ASSERT_SUCCESS( JlFreeObjectTree( &object ) );
        JL_ASSERT_NULL( object );
    }

    return TestReturn;
}